

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iio.c
# Opt level: O0

void * mraa_iio_event_handler(void *arg)

{
  mraa_result_t mVar1;
  mraa_iio_context dev;
  iio_event_data data;
  void *arg_local;
  
  data.timestamp = (longlong)arg;
  while( true ) {
    mVar1 = mraa_iio_event_poll_nonblock(*(int *)((long)arg + 0x14),(iio_event_data *)&dev);
    if (mVar1 != MRAA_SUCCESS) break;
    pthread_setcancelstate(1,(int *)0x0);
    (**(code **)((long)arg + 0x28))(&dev,*(undefined8 *)((long)arg + 0x20));
    pthread_setcancelstate(0,(int *)0x0);
  }
  pthread_setcancelstate(1,(int *)0x0);
  return (void *)0x0;
}

Assistant:

static void*
mraa_iio_event_handler(void* arg)
{
    struct iio_event_data data;
    mraa_iio_context dev = (mraa_iio_context) arg;

    for (;;) {
        if (mraa_iio_event_poll_nonblock(dev->fp_event, &data) == MRAA_SUCCESS) {
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            dev->isr_event(&data, dev->isr_args);
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
#endif
        } else {
            // we must have got an error code so die nicely
#ifdef HAVE_PTHREAD_CANCEL
            pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
#endif
            return NULL;
        }
    }
}